

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

optional<const_tinyusdz::PrimSpec_*> *
tinyusdz::anon_unknown_240::GetPrimSpecAtPathRec
          (optional<const_tinyusdz::PrimSpec_*> *__return_storage_ptr__,PrimSpec *parent,
          string *parent_path,Path *path,uint32_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pPVar3;
  _Alloc_hider _Var4;
  int iVar5;
  optional<const_tinyusdz::PrimSpec_*> *in_RAX;
  long *plVar6;
  optional<const_tinyusdz::PrimSpec_*> *extraout_RAX;
  size_type *psVar7;
  pointer parent_00;
  bool bVar8;
  string elementName;
  string abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_b0;
  storage_t<const_tinyusdz::PrimSpec_*> local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if ((depth < 0x8000001) && (parent != (PrimSpec *)0x0)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_b0 = local_a0;
    pcVar2 = (parent->_name)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (parent->_name)._M_string_length);
    local_50[0] = local_40;
    pcVar2 = (parent_path->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + parent_path->_M_string_length);
    ::std::__cxx11::string::append((char *)local_50);
    plVar6 = (long *)::std::__cxx11::string::_M_append((char *)local_50,(ulong)local_b0);
    paVar1 = &local_70.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70.field_2._8_8_ = plVar6[3];
      local_70._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_70._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    Path::full_path_name_abi_cxx11_(&local_70,path);
    _Var4._M_p = local_70._M_dataplus._M_p;
    if (local_90._M_string_length == local_70._M_string_length) {
      if (local_90._M_string_length == 0) {
        bVar8 = true;
      }
      else {
        iVar5 = bcmp(local_90._M_dataplus._M_p,local_70._M_dataplus._M_p,local_90._M_string_length);
        bVar8 = iVar5 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar1) {
      operator_delete(_Var4._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      __return_storage_ptr__->has_value_ = true;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::PrimSpec_*>)parent;
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
    }
    else {
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      parent_00 = (parent->_children).
                  super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pPVar3 = (parent->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (parent_00 != pPVar3) {
        do {
          GetPrimSpecAtPathRec
                    ((optional<const_tinyusdz::PrimSpec_*> *)&local_b0,parent_00,&local_90,path,
                     depth + 1);
          if (local_b0._0_1_ == (string)0x1) {
            __return_storage_ptr__->has_value_ = true;
            __return_storage_ptr__->contained = local_a8;
            goto LAB_0028fe61;
          }
          parent_00 = parent_00 + 1;
        } while (parent_00 != pPVar3);
      }
      __return_storage_ptr__->has_value_ = false;
      __return_storage_ptr__->contained = (storage_t<const_tinyusdz::PrimSpec_*>)0x0;
    }
LAB_0028fe61:
    in_RAX = (optional<const_tinyusdz::PrimSpec_*> *)&local_90.field_2;
    if ((optional<const_tinyusdz::PrimSpec_*> *)local_90._M_dataplus._M_p != in_RAX) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
      in_RAX = extraout_RAX;
    }
  }
  else {
    __return_storage_ptr__->has_value_ = false;
    __return_storage_ptr__->contained = (storage_t<const_tinyusdz::PrimSpec_*>)0x0;
  }
  return in_RAX;
}

Assistant:

nonstd::optional<const PrimSpec *> GetPrimSpecAtPathRec(
    const PrimSpec *parent, const std::string &parent_path, const Path &path,
    uint32_t depth) {
  if (depth > (1024 * 1024 * 128)) {
    // Too deep.
    return nonstd::nullopt;
  }

  if (!parent) {
    return nonstd::nullopt;
  }

  std::string abs_path;
  {
    std::string elementName = parent->name();

    abs_path = parent_path + "/" + elementName;

    if (abs_path == path.full_path_name()) {
      return parent;
    }
  }

  for (const auto &child : parent->children()) {
    if (auto pv = GetPrimSpecAtPathRec(&child, abs_path, path, depth + 1)) {
      return pv.value();
    }
  }

  // not found
  return nonstd::nullopt;
}